

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::updateVirialTensor(SPFForceManager *this)

{
  long in_RDI;
  double pressure_00;
  RealType pressure;
  Mat3x3d pressureTensor;
  Snapshot *in_stack_00000150;
  Thermo *in_stack_00000158;
  Mat3x3d virialTensor;
  Snapshot *in_stack_fffffffffffffe08;
  Snapshot *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe40;
  double in_stack_fffffffffffffe48;
  SPFForceManager *in_stack_fffffffffffffe50;
  Snapshot *in_stack_fffffffffffffed8;
  Thermo *in_stack_fffffffffffffee0;
  SquareMatrix3<double> *in_stack_ffffffffffffff88;
  SquareMatrix3<double> *in_stack_ffffffffffffff90;
  SPFForceManager *in_stack_ffffffffffffff98;
  
  Snapshot::getVirialTensor(in_stack_fffffffffffffe08);
  Snapshot::getVirialTensor(in_stack_fffffffffffffe08);
  linearCombination<OpenMD::SquareMatrix3<double>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35ea0c);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35ea19);
  Snapshot::setVirialTensor(in_stack_fffffffffffffe10,(Mat3x3d *)in_stack_fffffffffffffe08);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::operator->
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)0x35ea45);
  Thermo::getPressureTensor(in_stack_00000158,in_stack_00000150);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::operator->
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)0x35ea71);
  Thermo::getPressureTensor(in_stack_00000158,in_stack_00000150);
  linearCombination<OpenMD::SquareMatrix3<double>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35eab4);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35eabe);
  Snapshot::setPressureTensor(in_stack_fffffffffffffe10,(Mat3x3d *)in_stack_fffffffffffffe08);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::operator->
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)0x35eaea);
  Thermo::getPressure(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::operator->
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)0x35eb17);
  Thermo::getPressure(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  pressure_00 = linearCombination<double>
                          (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40);
  Snapshot::setPressure(*(Snapshot **)(in_RDI + 0xc90),pressure_00);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35eb83);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35eb90);
  return;
}

Assistant:

void SPFForceManager::updateVirialTensor() {
    Mat3x3d virialTensor =
        linearCombination(temporarySourceSnapshot_->getVirialTensor(),
                          temporarySinkSnapshot_->getVirialTensor());
    currentSnapshot_->setVirialTensor(virialTensor);

    Mat3x3d pressureTensor =
        linearCombination(thermo_->getPressureTensor(temporarySourceSnapshot_),
                          thermo_->getPressureTensor(temporarySinkSnapshot_));
    currentSnapshot_->setPressureTensor(pressureTensor);

    RealType pressure =
        linearCombination(thermo_->getPressure(temporarySourceSnapshot_),
                          thermo_->getPressure(temporarySinkSnapshot_));
    currentSnapshot_->setPressure(pressure);
  }